

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::relocate
          (QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *this,qsizetype offset
          ,pair<QPersistentModelIndex,_unsigned_int> **data)

{
  bool bVar1;
  pair<QPersistentModelIndex,_unsigned_int> *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  pair<QPersistentModelIndex,_unsigned_int> *res;
  
  first = (pair<QPersistentModelIndex,_unsigned_int> *)(*(long *)(in_RDI + 8) + in_RSI * 0x10);
  QtPrivate::q_relocate_overlap_n<std::pair<QPersistentModelIndex,unsigned_int>,long_long>
            (first,in_RDI,(pair<QPersistentModelIndex,_unsigned_int> *)0x83a287);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<QPersistentModelIndex,unsigned_int>>,std::pair<QPersistentModelIndex,unsigned_int>const*>
                        (data,(QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
                              res), bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  *(pair<QPersistentModelIndex,_unsigned_int> **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }